

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O2

int FE_Delete_Word(FORM *form)

{
  int iVar1;
  WINDOW_conflict *pWVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  
  iVar5 = form->current->dcols;
  pcVar6 = form->current->buf + (long)form->currow * (long)iVar5;
  iVar1 = form->curcol;
  Synchronize_Buffer(form);
  if (pcVar6[iVar1] == ' ') {
    iVar5 = -0xc;
  }
  else {
    iVar4 = iVar5 + (int)pcVar6;
    pcVar3 = After_Last_Whitespace_Character(pcVar6,form->curcol);
    Adjust_Cursor_Position(form,pcVar3);
    wmove(form->w,form->currow,form->curcol);
    wclrtoeol(form->w);
    pcVar3 = Get_First_Whitespace_Character(pcVar6 + iVar1,iVar5 - iVar1);
    pcVar3 = Get_Start_Of_Data(pcVar3,iVar4 - (int)pcVar3);
    iVar5 = 0;
    if ((pcVar3 != pcVar6 + iVar1) && (iVar5 = 0, *pcVar3 != ' ')) {
      pWVar2 = form->w;
      pcVar6 = After_End_Of_Data(pcVar3,iVar4 - (int)pcVar3);
      waddnstr(pWVar2,pcVar3,(int)pcVar3 - (int)pcVar6);
    }
  }
  return iVar5;
}

Assistant:

static int FE_Delete_Word(FORM * form)
{
  FIELD  *field = form->current;
  char   *bp = Address_Of_Current_Row_In_Buffer(form);
  char   *ep = bp + field->dcols;
  char   *cp = bp + form->curcol;
  char *s;
  
  Synchronize_Buffer(form);
  if (is_blank(*cp)) 
    return E_REQUEST_DENIED; /* not in word */

  /* move cursor to begin of word and erase to end of screen-line */
  Adjust_Cursor_Position(form,
                         After_Last_Whitespace_Character(bp,form->curcol)); 
  wmove(form->w,form->currow,form->curcol);
  wclrtoeol(form->w);

  /* skip over word in buffer */
  s = Get_First_Whitespace_Character(cp,(int)(ep-cp)); 
  /* to begin of next word    */
  s = Get_Start_Of_Data(s,(int)(ep - s));
  if ( (s!=cp) && !is_blank(*s))
    {
      /* copy remaining line to window */
      waddnstr(form->w,s,(int)(s - After_End_Of_Data(s,(int)(ep - s))));
    }
  return E_OK;
}